

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Nop(Compiler *this)

{
  uint32_t begin;
  PatchList end;
  Inst *in_RDI;
  int id;
  int in_stack_00000024;
  Compiler *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  Frag local_8;
  
  begin = AllocInst(in_stack_00000028,in_stack_00000024);
  if ((int)begin < 0) {
    local_8 = NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    PODArray<re2::Prog::Inst>::operator[]
              ((PODArray<re2::Prog::Inst> *)in_RDI,in_stack_ffffffffffffffdc);
    Prog::Inst::InitNop(in_RDI,in_stack_ffffffffffffffdc);
    end = PatchList::Mk(begin << 1);
    Frag::Frag(&local_8,begin,end);
  }
  return local_8;
}

Assistant:

Frag Compiler::Nop() {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitNop(0);
  return Frag(id, PatchList::Mk(id << 1));
}